

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printAVXCC(MCInst *MI,uint Op,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  int64_t Imm;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  iVar1 = MCOperand_getImm(op);
  switch((uint)iVar1 & 0x1f) {
  case 0:
    SStream_concat0(O,"eq");
    op_addAvxCC(MI,1);
    break;
  case 1:
    SStream_concat0(O,"lt");
    op_addAvxCC(MI,2);
    break;
  case 2:
    SStream_concat0(O,"le");
    op_addAvxCC(MI,3);
    break;
  case 3:
    SStream_concat0(O,"unord");
    op_addAvxCC(MI,4);
    break;
  case 4:
    SStream_concat0(O,"neq");
    op_addAvxCC(MI,5);
    break;
  case 5:
    SStream_concat0(O,"nlt");
    op_addAvxCC(MI,6);
    break;
  case 6:
    SStream_concat0(O,"nle");
    op_addAvxCC(MI,7);
    break;
  case 7:
    SStream_concat0(O,"ord");
    op_addAvxCC(MI,8);
    break;
  case 8:
    SStream_concat0(O,"eq_uq");
    op_addAvxCC(MI,9);
    break;
  case 9:
    SStream_concat0(O,"nge");
    op_addAvxCC(MI,10);
    break;
  case 10:
    SStream_concat0(O,"ngt");
    op_addAvxCC(MI,0xb);
    break;
  case 0xb:
    SStream_concat0(O,"false");
    op_addAvxCC(MI,0xc);
    break;
  case 0xc:
    SStream_concat0(O,"neq_oq");
    op_addAvxCC(MI,0xd);
    break;
  case 0xd:
    SStream_concat0(O,"ge");
    op_addAvxCC(MI,0xe);
    break;
  case 0xe:
    SStream_concat0(O,"gt");
    op_addAvxCC(MI,0xf);
    break;
  case 0xf:
    SStream_concat0(O,"true");
    op_addAvxCC(MI,0x10);
    break;
  case 0x10:
    SStream_concat0(O,"eq_os");
    op_addAvxCC(MI,0x11);
    break;
  case 0x11:
    SStream_concat0(O,"lt_oq");
    op_addAvxCC(MI,0x12);
    break;
  case 0x12:
    SStream_concat0(O,"le_oq");
    op_addAvxCC(MI,0x13);
    break;
  case 0x13:
    SStream_concat0(O,"unord_s");
    op_addAvxCC(MI,0x14);
    break;
  case 0x14:
    SStream_concat0(O,"neq_us");
    op_addAvxCC(MI,0x15);
    break;
  case 0x15:
    SStream_concat0(O,"nlt_uq");
    op_addAvxCC(MI,0x16);
    break;
  case 0x16:
    SStream_concat0(O,"nle_uq");
    op_addAvxCC(MI,0x17);
    break;
  case 0x17:
    SStream_concat0(O,"ord_s");
    op_addAvxCC(MI,0x18);
    break;
  case 0x18:
    SStream_concat0(O,"eq_us");
    op_addAvxCC(MI,0x19);
    break;
  case 0x19:
    SStream_concat0(O,"nge_uq");
    op_addAvxCC(MI,0x1a);
    break;
  case 0x1a:
    SStream_concat0(O,"ngt_uq");
    op_addAvxCC(MI,0x1b);
    break;
  case 0x1b:
    SStream_concat0(O,"false_os");
    op_addAvxCC(MI,0x1c);
    break;
  case 0x1c:
    SStream_concat0(O,"neq_os");
    op_addAvxCC(MI,0x1d);
    break;
  case 0x1d:
    SStream_concat0(O,"ge_oq");
    op_addAvxCC(MI,0x1e);
    break;
  case 0x1e:
    SStream_concat0(O,"gt_oq");
    op_addAvxCC(MI,0x1f);
    break;
  case 0x1f:
    SStream_concat0(O,"true_us");
    op_addAvxCC(MI,0x20);
  }
  return;
}

Assistant:

static void printAVXCC(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0x1f;
	switch (Imm) {
		default: break;//printf("Invalid avxcc argument!\n"); break;
		case    0: SStream_concat0(O, "eq"); op_addAvxCC(MI, X86_AVX_CC_EQ); break;
		case    1: SStream_concat0(O, "lt"); op_addAvxCC(MI, X86_AVX_CC_LT); break;
		case    2: SStream_concat0(O, "le"); op_addAvxCC(MI, X86_AVX_CC_LE); break;
		case    3: SStream_concat0(O, "unord"); op_addAvxCC(MI, X86_AVX_CC_UNORD); break;
		case    4: SStream_concat0(O, "neq"); op_addAvxCC(MI, X86_AVX_CC_NEQ); break;
		case    5: SStream_concat0(O, "nlt"); op_addAvxCC(MI, X86_AVX_CC_NLT); break;
		case    6: SStream_concat0(O, "nle"); op_addAvxCC(MI, X86_AVX_CC_NLE); break;
		case    7: SStream_concat0(O, "ord"); op_addAvxCC(MI, X86_AVX_CC_ORD); break;
		case    8: SStream_concat0(O, "eq_uq"); op_addAvxCC(MI, X86_AVX_CC_EQ_UQ); break;
		case    9: SStream_concat0(O, "nge"); op_addAvxCC(MI, X86_AVX_CC_NGE); break;
		case  0xa: SStream_concat0(O, "ngt"); op_addAvxCC(MI, X86_AVX_CC_NGT); break;
		case  0xb: SStream_concat0(O, "false"); op_addAvxCC(MI, X86_AVX_CC_FALSE); break;
		case  0xc: SStream_concat0(O, "neq_oq"); op_addAvxCC(MI, X86_AVX_CC_NEQ_OQ); break;
		case  0xd: SStream_concat0(O, "ge"); op_addAvxCC(MI, X86_AVX_CC_GE); break;
		case  0xe: SStream_concat0(O, "gt"); op_addAvxCC(MI, X86_AVX_CC_GT); break;
		case  0xf: SStream_concat0(O, "true"); op_addAvxCC(MI, X86_AVX_CC_TRUE); break;
		case 0x10: SStream_concat0(O, "eq_os"); op_addAvxCC(MI, X86_AVX_CC_EQ_OS); break;
		case 0x11: SStream_concat0(O, "lt_oq"); op_addAvxCC(MI, X86_AVX_CC_LT_OQ); break;
		case 0x12: SStream_concat0(O, "le_oq"); op_addAvxCC(MI, X86_AVX_CC_LE_OQ); break;
		case 0x13: SStream_concat0(O, "unord_s"); op_addAvxCC(MI, X86_AVX_CC_UNORD_S); break;
		case 0x14: SStream_concat0(O, "neq_us"); op_addAvxCC(MI, X86_AVX_CC_NEQ_US); break;
		case 0x15: SStream_concat0(O, "nlt_uq"); op_addAvxCC(MI, X86_AVX_CC_NLT_UQ); break;
		case 0x16: SStream_concat0(O, "nle_uq"); op_addAvxCC(MI, X86_AVX_CC_NLE_UQ); break;
		case 0x17: SStream_concat0(O, "ord_s"); op_addAvxCC(MI, X86_AVX_CC_ORD_S); break;
		case 0x18: SStream_concat0(O, "eq_us"); op_addAvxCC(MI, X86_AVX_CC_EQ_US); break;
		case 0x19: SStream_concat0(O, "nge_uq"); op_addAvxCC(MI, X86_AVX_CC_NGE_UQ); break;
		case 0x1a: SStream_concat0(O, "ngt_uq"); op_addAvxCC(MI, X86_AVX_CC_NGT_UQ); break;
		case 0x1b: SStream_concat0(O, "false_os"); op_addAvxCC(MI, X86_AVX_CC_FALSE_OS); break;
		case 0x1c: SStream_concat0(O, "neq_os"); op_addAvxCC(MI, X86_AVX_CC_NEQ_OS); break;
		case 0x1d: SStream_concat0(O, "ge_oq"); op_addAvxCC(MI, X86_AVX_CC_GE_OQ); break;
		case 0x1e: SStream_concat0(O, "gt_oq"); op_addAvxCC(MI, X86_AVX_CC_GT_OQ); break;
		case 0x1f: SStream_concat0(O, "true_us"); op_addAvxCC(MI, X86_AVX_CC_TRUE_US); break;
	}
}